

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LayerNormalizationLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x546) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x546;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x40);
    LayerNormalizationLayerParams::LayerNormalizationLayerParams(this_00.layernormalization_);
    (this->layer_).layernormalization_ = (LayerNormalizationLayerParams *)this_00;
  }
  return (LayerNormalizationLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LayerNormalizationLayerParams* NeuralNetworkLayer::mutable_layernormalization() {
  if (!has_layernormalization()) {
    clear_layer();
    set_has_layernormalization();
    layer_.layernormalization_ = new ::CoreML::Specification::LayerNormalizationLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.layerNormalization)
  return layer_.layernormalization_;
}